

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

RAMBlock *
qemu_ram_block_from_host_x86_64
          (uc_struct_conflict *uc,void *ptr,_Bool round_offset,ram_addr_t *offset)

{
  RAMBlock *pRVar1;
  uint8_t *host;
  ulong uVar2;
  ulong uVar3;
  
  pRVar1 = (uc->ram_list).mru_block;
  if (((pRVar1 == (RAMBlock *)0x0) || (pRVar1->host == (uint8_t *)0x0)) ||
     (uVar3 = (long)ptr - (long)pRVar1->host, pRVar1->max_length <= uVar3)) {
    pRVar1 = (uc->ram_list).blocks.lh_first;
    while( true ) {
      if (pRVar1 == (RAMBlock *)0x0) {
        return (RAMBlock *)0x0;
      }
      if ((pRVar1->host != (uint8_t *)0x0) &&
         (uVar3 = (long)ptr - (long)pRVar1->host, uVar3 < pRVar1->max_length)) break;
      pRVar1 = (pRVar1->next).le_next;
    }
  }
  uVar2 = uVar3 & 0xfffffffffffff000;
  if (!round_offset) {
    uVar2 = uVar3;
  }
  *offset = uVar2;
  return pRVar1;
}

Assistant:

RAMBlock *qemu_ram_block_from_host(struct uc_struct *uc, void *ptr,
                                   bool round_offset, ram_addr_t *offset)
{
    RAMBlock *block;
    uint8_t *host = ptr;

    block = uc->ram_list.mru_block;
    if (block && block->host && host - block->host < block->max_length) {
        goto found;
    }

    RAMBLOCK_FOREACH(block) {
        /* This case append when the block is not mapped. */
        if (block->host == NULL) {
            continue;
        }
        if (host - block->host < block->max_length) {
            goto found;
        }
    }

    return NULL;

found:
    *offset = (host - block->host);
    if (round_offset) {
        *offset &= TARGET_PAGE_MASK;
    }
    return block;
}